

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Status SVar6;
  char *pcVar7;
  char *pcVar8;
  Interpreter *this_00;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pbVar9;
  pointer pbVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  writer write_8;
  StringArray unresolved;
  string errorMessage;
  undefined1 local_128 [40];
  Error error;
  writer write_3;
  undefined1 local_c0 [40];
  undefined1 local_98 [64];
  undefined4 local_58;
  string local_50 [32];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  if ((this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar3 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,
                                 mMultiNetworkSyntax_abi_cxx11_,aExpr);
      if (bVar3) {
        if ((this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          psVar2 = (this->mContext).mDomAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->mContext).mDomAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) < 0x21) {
            SVar6 = persistent_storage::Registry::GetNetworkXpansInDomain
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,psVar2,aNids);
            if (SVar6 != kSuccess) {
              if (SVar6 == kNotFound) {
                errorMessage._M_dataplus._M_p._0_4_ = 0xd;
                errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89d9;
                errorMessage.field_2._M_allocated_capacity = 0x15;
                errorMessage.field_2._8_8_ = 0x100000000;
                pcVar7 = "domain \'{}\' not found";
                while (pcVar8 = pcVar7, pcVar8 != "") {
                  pcVar7 = pcVar8 + 1;
                  if (*pcVar8 == '}') {
                    if ((pcVar7 == "") || (*pcVar7 != '}')) {
                      ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                    }
                    pcVar7 = pcVar8 + 2;
                  }
                  else if (*pcVar8 == '{') {
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar8,"",(format_string_checker<char> *)&errorMessage);
                  }
                }
                pbVar9 = (this->mContext).mDomAliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                errorMessage._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
                errorMessage._M_string_length = pbVar9->_M_string_length;
                fmt_02.size_ = 0xd;
                fmt_02.data_ = (char *)0x15;
                args_09.field_1.values_ = in_R9.values_;
                args_09.desc_ = (unsigned_long_long)&errorMessage;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&write_8,(v10 *)"domain \'{}\' not found",fmt_02,args_09);
                local_128._0_4_ = kRegistryError;
                std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
              }
              else {
                errorMessage._M_dataplus._M_p = (pointer)0x10000000d;
                errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89e6;
                errorMessage.field_2._M_allocated_capacity = 0x2c;
                errorMessage.field_2._8_8_ = 0x200000000;
                pcVar7 = "domain \'{}\' failed to resolve with status={}";
                unresolved.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
                while (pcVar7 != "") {
                  cVar1 = *pcVar7;
                  pcVar8 = pcVar7;
                  while (cVar1 != '{') {
                    pcVar8 = pcVar8 + 1;
                    if (pcVar8 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      ::writer::operator()((writer *)&unresolved,pcVar7,"");
                      goto LAB_0019e3f6;
                    }
                    cVar1 = *pcVar8;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::writer::operator()((writer *)&unresolved,pcVar7,pcVar8);
                  pcVar7 = ::fmt::v10::detail::
                           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,int>&>
                                     (pcVar8,"",
                                      (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&errorMessage);
                }
LAB_0019e3f6:
                pbVar9 = (this->mContext).mDomAliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                errorMessage._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
                errorMessage._M_string_length = pbVar9->_M_string_length;
                errorMessage.field_2._M_allocated_capacity = (size_type)SVar6;
                fmt_03.size_ = 0x1d;
                fmt_03.data_ = (char *)0x2c;
                args_10.field_1.values_ = in_R9.values_;
                args_10.desc_ = (unsigned_long_long)&errorMessage;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&write_8,
                           (v10 *)"domain \'{}\' failed to resolve with status={}",fmt_03,args_10);
                local_128._0_4_ = kRegistryError;
                std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
              }
              Error::operator=(&error,(Error *)local_128);
              std::__cxx11::string::~string((string *)(local_128 + 8));
              std::__cxx11::string::~string((string *)&write_8);
              goto LAB_0019e2ab;
            }
            goto LAB_0019e150;
          }
          errorMessage._M_dataplus._M_p =
               (pointer)((ulong)errorMessage._M_dataplus._M_p._4_4_ << 0x20);
          errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89cc;
          errorMessage.field_2._M_allocated_capacity = 0x29;
          errorMessage.field_2._8_8_ = 0;
          pcVar7 = "multiple domain specification not allowed";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()((writer *)&unresolved,pcVar7,"");
                goto LAB_0019e1fd;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&unresolved,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)&errorMessage);
          }
LAB_0019e1fd:
          args_07.field_1.values_ = in_R9.values_;
          args_07.desc_ = (unsigned_long_long)&errorMessage;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_8,(v10 *)"multiple domain specification not allowed",
                     (string_view)ZEXT816(0x29),args_07);
          local_128._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
        }
        else {
          errorMessage._M_dataplus._M_p = errorMessage._M_dataplus._M_p & 0xffffffff00000000;
          errorMessage._M_string_length = (size_type)anon_var_dwarf_1d898d;
          errorMessage.field_2._M_allocated_capacity = 0x26;
          errorMessage.field_2._8_8_ = 0;
          pcVar7 = "--nwk and --dom are mutually exclusive";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()((writer *)&unresolved,pcVar7,"");
                goto LAB_0019dd35;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&unresolved,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)&errorMessage);
          }
LAB_0019dd35:
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&errorMessage;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_8,(v10 *)"--nwk and --dom are mutually exclusive",
                     (string_view)ZEXT816(0x26),args_03);
          local_128._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
        }
      }
      else {
        errorMessage._M_dataplus._M_p._0_4_ = 0xc;
        errorMessage._M_string_length = (size_type)anon_var_dwarf_1d8951;
        errorMessage.field_2._M_allocated_capacity = 0x24;
        errorMessage.field_2._8_8_ = 0x100000000;
        pcVar7 = "\'{}\' is not supported by the command";
        unresolved.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>
              ::writer::operator()((writer *)&unresolved,pcVar7,"");
              goto LAB_0019db53;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
          writer::operator()((writer *)&unresolved,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                             (pcVar8,"",(format_string_checker<char> *)&errorMessage);
        }
LAB_0019db53:
        errorMessage._M_dataplus._M_p = "--dom";
        fmt_00.size_ = 0xc;
        fmt_00.data_ = (char *)0x24;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)&errorMessage;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_8,(v10 *)"\'{}\' is not supported by the command",fmt_00,args_02
                  );
        local_128._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
      }
      goto LAB_0019e281;
    }
    errorMessage._M_dataplus._M_p = errorMessage._M_dataplus._M_p & 0xffffffff00000000;
    errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89f3;
    errorMessage.field_2._M_allocated_capacity = 0x49;
    errorMessage.field_2._8_8_ = 0;
    pcVar7 = "Either network or domain list must have entries for multi-network command";
    write_8.handler_ = (format_string_checker<char> *)&errorMessage;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar8 = pcVar7;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write_8,pcVar7,"");
          goto LAB_0019da5d;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write_8,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar8,"",(format_string_checker<char> *)&errorMessage);
    }
LAB_0019da5d:
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&errorMessage;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_128,
               (v10 *)"Either network or domain list must have entries for multi-network command",
               (string_view)ZEXT816(0x49),args_01);
    local_58 = 2;
    std::__cxx11::string::string(local_50,(string *)local_128);
    std::__cxx11::string::~string(local_50);
    this_01 = (string *)local_128;
  }
  else {
    bVar3 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,mMultiNetworkSyntax_abi_cxx11_,
                               aExpr);
    bVar5 = false;
    if ((((this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) &&
        (__lhs = (this->mContext).mNwkAliases.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (long)(this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__lhs == 0x20)) &&
       (bVar4 = std::operator!=(__lhs,"all"), bVar4)) {
      bVar5 = std::operator!=((this->mContext).mNwkAliases.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"other");
    }
    if (bVar5 != false || bVar3) {
      if ((this->mContext).mDomAliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->mContext).mDomAliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        errorMessage._M_dataplus._M_p =
             (pointer)((ulong)errorMessage._M_dataplus._M_p._4_4_ << 0x20);
        errorMessage._M_string_length = (size_type)anon_var_dwarf_1d898d;
        errorMessage.field_2._M_allocated_capacity = 0x26;
        errorMessage.field_2._8_8_ = 0;
        pcVar7 = "--nwk and --dom are mutually exclusive";
        unresolved.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&unresolved,pcVar7,"");
              goto LAB_0019d8d9;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&unresolved,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",(format_string_checker<char> *)&errorMessage);
        }
LAB_0019d8d9:
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&errorMessage;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_8,(v10 *)"--nwk and --dom are mutually exclusive",
                   (string_view)ZEXT816(0x26),args);
        local_128._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
LAB_0019de53:
        Error::operator=(&error,(Error *)local_128);
        std::__cxx11::string::~string((string *)(local_128 + 8));
        std::__cxx11::string::~string((string *)&write_8);
        goto LAB_0019e2ab;
      }
      pbVar10 = (this->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar9 = (this->mContext).mNwkAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar10;
          pbVar9 = pbVar9 + 1) {
        bVar3 = std::operator==(pbVar9,"all");
        if (((bVar3) || (bVar3 = std::operator==(pbVar9,"other"), bVar3)) &&
           ((long)(this->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
          errorMessage._M_dataplus._M_p._0_4_ = 0xd;
          errorMessage._M_string_length = (size_type)anon_var_dwarf_1d899a;
          errorMessage.field_2._M_allocated_capacity = 0x32;
          errorMessage.field_2._8_8_ = 0x100000000;
          pcVar7 = "\'{}\' must not combine with any other network alias";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&unresolved,pcVar7,"");
                goto LAB_0019de12;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&unresolved,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",(format_string_checker<char> *)&errorMessage);
          }
LAB_0019de12:
          errorMessage._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          errorMessage._M_string_length = pbVar9->_M_string_length;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = (char *)0x32;
          args_04.field_1.args_ = in_R9.args_;
          args_04.desc_ = (unsigned_long_long)&errorMessage;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_8,
                     (v10 *)"\'{}\' must not combine with any other network alias",fmt_01,args_04);
          local_128._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
          goto LAB_0019de53;
        }
      }
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SVar6 = persistent_storage::Registry::GetNetworkXpansByAliases
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(StringArray *)this,aNids,&unresolved);
      pbVar9 = unresolved.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (string *)(local_98 + 0x20);
      for (pbVar10 = unresolved.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar9;
          pbVar10 = pbVar10 + 1) {
        errorMessage._M_string_length = 0;
        errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
        errorMessage.field_2._M_allocated_capacity =
             errorMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::assign((char *)&errorMessage);
        std::__cxx11::string::string((string *)psVar2,(string *)pbVar10);
        this_00 = (Interpreter *)local_98;
        std::__cxx11::string::string((string *)local_98,(string *)&errorMessage);
        PrintNetworkMessage(this_00,psVar2,(string *)local_98,kYellow);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)psVar2);
        std::__cxx11::string::~string((string *)&errorMessage);
      }
      if ((aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        errorMessage._M_dataplus._M_p =
             (pointer)((ulong)errorMessage._M_dataplus._M_p._4_4_ << 0x20);
        errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89b3;
        errorMessage.field_2._M_allocated_capacity = 0x39;
        errorMessage.field_2._8_8_ = 0;
        pcVar7 = "specified alias(es) resolved to an empty list of networks";
        write_3.handler_ = (format_string_checker<char> *)&errorMessage;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write_3,pcVar7,"");
              goto LAB_0019e049;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write_3,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",(format_string_checker<char> *)&errorMessage);
        }
LAB_0019e049:
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)&errorMessage;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_8,
                   (v10 *)"specified alias(es) resolved to an empty list of networks",
                   (string_view)ZEXT816(0x39),args_06);
        local_128._0_4_ = kRegistryError;
        std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
        Error::operator=(&error,(Error *)local_128);
        std::__cxx11::string::~string((string *)(local_128 + 8));
        std::__cxx11::string::~string((string *)&write_8);
      }
      else {
        if (SVar6 == kSuccess) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&unresolved);
LAB_0019e150:
          if ((aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start) goto LAB_0019e2ab;
          errorMessage._M_dataplus._M_p = errorMessage._M_dataplus._M_p & 0xffffffff00000000;
          errorMessage._M_string_length = (size_type)anon_var_dwarf_1d89b3;
          errorMessage.field_2._M_allocated_capacity = 0x39;
          errorMessage.field_2._8_8_ = 0;
          pcVar7 = "specified alias(es) resolved to an empty list of networks";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()((writer *)&unresolved,pcVar7,"");
                goto LAB_0019e24a;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&unresolved,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)&errorMessage);
          }
LAB_0019e24a:
          args_08.field_1.args_ = in_R9.args_;
          args_08.desc_ = (unsigned_long_long)&errorMessage;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_8,
                     (v10 *)"specified alias(es) resolved to an empty list of networks",
                     (string_view)ZEXT816(0x39),args_08);
          local_128._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
          goto LAB_0019e281;
        }
        errorMessage._M_dataplus._M_p =
             (pointer)((ulong)errorMessage._M_dataplus._M_p._4_4_ << 0x20);
        errorMessage._M_string_length = (size_type)anon_var_dwarf_1d3075;
        errorMessage.field_2._M_allocated_capacity = 0x11;
        errorMessage.field_2._8_8_ = 0;
        pcVar7 = "failed to resolve";
        while (pcVar8 = pcVar7, pcVar8 != "") {
          pcVar7 = pcVar8 + 1;
          if (*pcVar8 == '}') {
            if ((pcVar7 == "") || (*pcVar7 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar7 = pcVar8 + 2;
          }
          else if (*pcVar8 == '{') {
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)&errorMessage);
          }
        }
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)&errorMessage;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_8,(v10 *)"failed to resolve",(string_view)ZEXT816(0x11),args_05)
        ;
        local_128._0_4_ = kRegistryError;
        std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
        Error::operator=(&error,(Error *)local_128);
        std::__cxx11::string::~string((string *)(local_128 + 8));
        std::__cxx11::string::~string((string *)&write_8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&unresolved);
      goto LAB_0019e2ab;
    }
    errorMessage._M_dataplus._M_p._0_4_ = 0xc;
    errorMessage._M_string_length = (size_type)anon_var_dwarf_1d8951;
    errorMessage.field_2._M_allocated_capacity = 0x24;
    errorMessage.field_2._8_8_ = 0x100000000;
    pcVar7 = "\'{}\' is not supported by the command";
    unresolved.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&errorMessage;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar8 = pcVar7;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
          writer::operator()((writer *)&unresolved,pcVar7,"");
          goto LAB_0019d929;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
      writer::operator()((writer *)&unresolved,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                         (pcVar8,"",(format_string_checker<char> *)&errorMessage);
    }
LAB_0019d929:
    errorMessage._M_dataplus._M_p = "--nwk";
    fmt.size_ = 0xc;
    fmt.data_ = (char *)0x24;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&errorMessage;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&write_8,(v10 *)"\'{}\' is not supported by the command",fmt,args_00);
    local_128._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_128 + 8),(string *)&write_8);
LAB_0019e281:
    Error::operator=(&error,(Error *)local_128);
    std::__cxx11::string::~string((string *)(local_128 + 8));
    this_01 = (string *)&write_8;
  }
  std::__cxx11::string::~string(this_01);
LAB_0019e2ab:
  Error::Error((Error *)local_c0,&error);
  Value::Value(__return_storage_ptr__,(Error *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 8));
  std::__cxx11::string::~string((string *)&error.mMessage);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ValidateMultiNetworkSyntax(const Expression &aExpr, std::vector<uint64_t> &aNids)
{
    Error error;
    bool  supported;

    if (mContext.mNwkAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        // MN-syntax is also supported for import from multi-entry JSON
        supported |= mContext.mImportFiles.size() > 0 && mContext.mNwkAliases.size() == 1 &&
                     mContext.mNwkAliases[0] != ALIAS_ALL && mContext.mNwkAliases[0] != ALIAS_OTHERS;
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_NETWORK));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mDomAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // validate group alias usage; if used, it must be alone
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                VerifyOrExit(mContext.mNwkAliases.size() == 1, error = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
            }
        }
        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, aNids, unresolved);
        for (const auto &alias : unresolved)
        {
            std::string errorMessage;
            switch (status)
            {
            case RegistryStatus::kAmbiguity:
                errorMessage = "alias ambiguous";
                break;
            case RegistryStatus::kSuccess:  // partially successful resolution
            case RegistryStatus::kNotFound: // failed to find any
                errorMessage = "alias not found";
                break;
            default:
                errorMessage = RUNTIME_RESOLVING_FAILED;
            }
            PrintNetworkMessage(alias, errorMessage, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(aNids.size() > 0, error = ERROR_REGISTRY_ERROR(RUNTIME_EMPTY_NIDS));
        VerifyOrExit(status == RegistryStatus::kSuccess, error = ERROR_REGISTRY_ERROR(RUNTIME_RESOLVING_FAILED));
    }
    else if (mContext.mDomAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_DOMAIN));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mNwkAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // domain must be single
        VerifyOrExit(mContext.mDomAliases.size() < 2, error = ERROR_INVALID_ARGS(SYNTAX_MULTI_DOMAIN));
        RegistryStatus status = mRegistry->GetNetworkXpansInDomain(mContext.mDomAliases.front(), aNids);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     error = status == RegistryStatus::kNotFound
                                 ? ERROR_REGISTRY_ERROR("domain '{}' not found", mContext.mDomAliases[0])
                                 : ERROR_REGISTRY_ERROR("domain '{}' failed to resolve with status={}",
                                                        mContext.mDomAliases.front(), static_cast<int>(status)));
    }
    else
    {
        // as we came here to evaluate multi-network command, either
        // network or domain list must have entries
        VerifyOrExit(false,
                     ERROR_INVALID_ARGS(
                         "Either network or domain list must have entries for multi-network command")); // must not hit
                                                                                                        // this, ever
    }

    VerifyOrExit(aNids.size() > 0, error = ERROR_INVALID_ARGS(RUNTIME_EMPTY_NIDS));
exit:
    return error;
}